

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.cpp
# Opt level: O0

uint16_t anon_unknown.dwarf_39fe24::get_attribute_address(uint16_t vram_addr)

{
  uint16_t vram_addr_local;
  
  return vram_addr & 0xc00 | 0x23c0 | (ushort)((int)(uint)vram_addr >> 4) & 0x38 |
         (ushort)((int)(uint)vram_addr >> 2) & 7;
}

Assistant:

constexpr uint16_t get_attribute_address(uint16_t vram_addr) {
    return 0x23C0u | (vram_addr & 0x0C00u) |
           (static_cast<uint16_t>(vram_addr >> 4u) & 0x38u) |
           (static_cast<uint16_t>(vram_addr >> 2u) & 0x07u);
}